

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pTextureCases.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::Texture2DRenderCase::init(Texture2DRenderCase *this,EVP_PKEY_CTX *ctx)

{
  Mat3 *mtx;
  int iVar1;
  int iVar2;
  TestLog *pTVar3;
  int iVar4;
  DataType dataType;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar7;
  ostream *poVar8;
  Texture2D *this_00;
  ChannelType CVar9;
  ulong uVar10;
  int texNdx;
  EVP_PKEY_CTX *ctx_00;
  Precision precision;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  bool bVar15;
  uint local_288;
  uint local_284;
  undefined1 local_268 [8];
  undefined8 uStack_260;
  undefined1 local_258 [8];
  undefined8 uStack_250;
  Texture2D *texture;
  float afStack_230 [2];
  Vector<float,_2> local_228;
  Vector<float,_2> local_220;
  Vector<float,_2> local_218;
  Vector<float,_2> local_210;
  TextureFormatInfo fmtInfo;
  TextureFormat texFormat;
  ostringstream fragSrc;
  ostringstream local_1b8 [376];
  Texture2D *local_40;
  float afStack_38 [2];
  
  pTVar3 = ((this->super_ShaderPerformanceCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  texFormat = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo(&fmtInfo,&texFormat);
  CVar9 = texFormat.type & ~SNORM_INT32;
  bVar15 = texFormat.type == SIGNED_INT32;
  dataType = glu::getSampler2DType(texFormat);
  iVar5 = (*((this->super_ShaderPerformanceCase).m_renderCtx)->_vptr_RenderContext[4])();
  local_284 = *(uint *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*((this->super_ShaderPerformanceCase).m_renderCtx)->_vptr_RenderContext[4])();
  local_288 = *(uint *)(CONCAT44(extraout_var_00,iVar5) + 4);
  if (this->m_powerOfTwo == true) {
    iVar5 = 0x1f;
    if (local_284 != 0) {
      for (; local_284 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    iVar4 = 0x1f;
    if (local_288 != 0) {
      for (; local_288 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    local_284 = local_284 & -(0x80000000U >> (~(byte)iVar5 & 0x1f));
    local_288 = local_288 & -(0x80000000U >> (~(byte)iVar4 & 0x1f));
  }
  uVar6 = this->m_minFilter;
  local_258 = (undefined1  [8])0x0;
  mtx = &this->m_coordTransform;
  uStack_250._0_4_ = 1.0;
  tcu::operator*((tcu *)&fragSrc,mtx,(Vector<float,_3> *)local_258);
  local_218.m_data = (float  [2])_fragSrc;
  local_258 = (undefined1  [8])0x3f800000;
  uStack_250._0_4_ = 1.0;
  tcu::operator*((tcu *)&fragSrc,mtx,(Vector<float,_3> *)local_258);
  local_220.m_data = (float  [2])_fragSrc;
  local_258 = (undefined1  [8])0x3f80000000000000;
  uStack_250._0_4_ = 1.0;
  tcu::operator*((tcu *)&fragSrc,mtx,(Vector<float,_3> *)local_258);
  local_228.m_data = (float  [2])_fragSrc;
  local_258 = (undefined1  [8])0x3f8000003f800000;
  uStack_250._0_4_ = 1.0;
  tcu::operator*((tcu *)&fragSrc,mtx,(Vector<float,_3> *)local_258);
  local_210.m_data = (float  [2])_fragSrc;
  local_258._0_4_ = local_218.m_data[0];
  local_258._4_4_ = local_218.m_data[1];
  uStack_250._0_4_ = 0.0;
  uStack_250._4_4_ = 0.0;
  local_268._0_4_ = local_220.m_data[0];
  local_268._4_4_ = local_220.m_data[1];
  uStack_260._0_4_ = 0.0;
  uStack_260._4_4_ = 0.0;
  texture = (Texture2D *)local_228.m_data;
  afStack_230[0] = 0.0;
  afStack_230[1] = 0.0;
  local_40 = (Texture2D *)_fragSrc;
  afStack_38[0] = 0.0;
  afStack_38[1] = 0.0;
  deqp::gls::AttribSpec::AttribSpec
            ((AttribSpec *)&fragSrc,"a_coords",(Vec4 *)local_258,(Vec4 *)local_268,(Vec4 *)&texture,
             (Vec4 *)&local_40);
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
  emplace_back<deqp::gls::AttribSpec>
            (&(this->super_ShaderPerformanceCase).m_attributes,(AttribSpec *)&fragSrc);
  std::__cxx11::string::~string((string *)&fragSrc);
  _fragSrc = (pointer)pTVar3;
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  std::operator<<((ostream *)local_1b8,"Size: ");
  std::ostream::operator<<(local_1b8,local_284);
  std::operator<<((ostream *)local_1b8,"x");
  std::ostream::operator<<(local_1b8,local_288);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fragSrc,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  _fragSrc = (pointer)pTVar3;
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  std::operator<<((ostream *)local_1b8,"Format: ");
  pcVar7 = glu::getTextureFormatName(this->m_internalFormat);
  std::operator<<((ostream *)local_1b8,pcVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fragSrc,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  _fragSrc = (pointer)pTVar3;
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  std::operator<<((ostream *)local_1b8,"Coords: ");
  tcu::operator<<((ostream *)local_1b8,&local_218);
  std::operator<<((ostream *)local_1b8,", ");
  tcu::operator<<((ostream *)local_1b8,&local_220);
  std::operator<<((ostream *)local_1b8,", ");
  tcu::operator<<((ostream *)local_1b8,&local_228);
  std::operator<<((ostream *)local_1b8,", ");
  tcu::operator<<((ostream *)local_1b8,&local_210);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fragSrc,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  _fragSrc = (pointer)pTVar3;
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  std::operator<<((ostream *)local_1b8,"Wrap: ");
  local_258 = (undefined1  [8])glu::getTextureWrapModeName;
  uStack_250._0_4_ = (float)this->m_wrapS;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_258,(ostream *)local_1b8);
  std::operator<<((ostream *)local_1b8," / ");
  local_268 = (undefined1  [8])glu::getTextureWrapModeName;
  uStack_260._0_4_ = (float)this->m_wrapT;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_268,(ostream *)local_1b8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fragSrc,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  _fragSrc = (pointer)pTVar3;
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  std::operator<<((ostream *)local_1b8,"Filter: ");
  local_258 = (undefined1  [8])glu::getTextureFilterName;
  uStack_250._0_4_ = (float)this->m_minFilter;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_258,(ostream *)local_1b8);
  std::operator<<((ostream *)local_1b8," / ");
  local_268 = (undefined1  [8])glu::getTextureFilterName;
  uStack_260._0_4_ = (float)this->m_magFilter;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_268,(ostream *)local_1b8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fragSrc,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  _fragSrc = (pointer)pTVar3;
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  std::operator<<((ostream *)local_1b8,"Mipmaps: ");
  uVar6 = uVar6 & 0xfffffffc;
  pcVar7 = "false";
  if (uVar6 == 0x2700) {
    pcVar7 = "true";
  }
  std::operator<<((ostream *)local_1b8,pcVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fragSrc,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  _fragSrc = (pointer)pTVar3;
  std::__cxx11::ostringstream::ostringstream(local_1b8);
  std::operator<<((ostream *)local_1b8,"Using additive blending.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&fragSrc,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1b8);
  deqp::gls::ShaderPerformanceCase::setViewportSize
            (&this->super_ShaderPerformanceCase,local_284,local_288);
  std::__cxx11::string::assign((char *)&(this->super_ShaderPerformanceCase).m_vertShaderSource);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fragSrc);
  std::operator<<((ostream *)&fragSrc,"#version 300 es\n");
  std::operator<<((ostream *)&fragSrc,"layout(location = 0) out mediump vec4 o_color;\n");
  std::operator<<((ostream *)&fragSrc,"in mediump vec2 v_coords;\n");
  precision = (bVar15 || CVar9 == UNSIGNED_INT32) + PRECISION_MEDIUMP;
  for (iVar5 = 0; iVar5 < this->m_numTextures; iVar5 = iVar5 + 1) {
    poVar8 = std::operator<<((ostream *)&fragSrc,"uniform ");
    pcVar7 = glu::getPrecisionName(precision);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    pcVar7 = glu::getDataTypeName(dataType);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," u_sampler");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
    std::operator<<(poVar8,";\n");
  }
  poVar8 = std::operator<<((ostream *)&fragSrc,"void main (void)\n");
  std::operator<<(poVar8,"{\n");
  for (iVar5 = 0; iVar5 < this->m_numTextures; iVar5 = iVar5 + 1) {
    pcVar7 = "\tr += ";
    poVar8 = (ostream *)&fragSrc;
    if (iVar5 == 0) {
      poVar8 = std::operator<<((ostream *)&fragSrc,"\t");
      pcVar7 = glu::getPrecisionName(precision);
      poVar8 = std::operator<<(poVar8,pcVar7);
      pcVar7 = " vec4 r = ";
    }
    std::operator<<(poVar8,pcVar7);
    if ((dataType == TYPE_UINT_SAMPLER_2D) || (dataType == TYPE_INT_SAMPLER_2D)) {
      std::operator<<((ostream *)&fragSrc,"vec4(");
    }
    poVar8 = std::operator<<((ostream *)&fragSrc,"texture(u_sampler");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
    std::operator<<(poVar8,", v_coords)");
    if ((dataType == TYPE_UINT_SAMPLER_2D) || (dataType == TYPE_INT_SAMPLER_2D)) {
      std::operator<<((ostream *)&fragSrc,")");
    }
    std::operator<<((ostream *)&fragSrc,";\n");
  }
  poVar8 = std::operator<<((ostream *)&fragSrc,"\to_color = r;\n");
  std::operator<<(poVar8,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderPerformanceCase).m_fragShaderSource,(string *)local_258);
  std::__cxx11::string::~string((string *)local_258);
  ctx_00 = (EVP_PKEY_CTX *)(long)this->m_numTextures;
  std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::reserve
            (&this->m_textures,(size_type)ctx_00);
  for (uVar13 = 0; (int)uVar13 < this->m_numTextures; uVar13 = uVar13 + 1) {
    if ((init()::swizzles == '\0') && (iVar5 = __cxa_guard_acquire(&init()::swizzles), iVar5 != 0))
    {
      init::swizzles[0].m_data[0] = _DAT_009b78c0;
      init::swizzles[0].m_data[1] = _UNK_009b78c4;
      init::swizzles[0].m_data[2] = _UNK_009b78c8;
      init::swizzles[0].m_data[3] = _UNK_009b78cc;
      init::swizzles[1].m_data[0] = _DAT_00a06c00;
      init::swizzles[1].m_data[1] = _UNK_00a06c04;
      init::swizzles[1].m_data[2] = _UNK_00a06c08;
      init::swizzles[1].m_data[3] = _UNK_00a06c0c;
      init::swizzles[2].m_data[0] = _DAT_00a06c10;
      init::swizzles[2].m_data[1] = _UNK_00a06c14;
      init::swizzles[2].m_data[2] = _UNK_00a06c18;
      init::swizzles[2].m_data[3] = _UNK_00a06c1c;
      init::swizzles[3].m_data[0] = _DAT_009b78e0;
      init::swizzles[3].m_data[1] = _UNK_009b78e4;
      init::swizzles[3].m_data[2] = _UNK_009b78e8;
      init::swizzles[3].m_data[3] = _UNK_009b78ec;
      init::swizzles[4].m_data[0] = _DAT_00a06c20;
      init::swizzles[4].m_data[1] = _UNK_00a06c24;
      init::swizzles[4].m_data[2] = _UNK_00a06c28;
      init::swizzles[4].m_data[3] = _UNK_00a06c2c;
      init::swizzles[5].m_data[0] = _DAT_009f41e0;
      init::swizzles[5].m_data[1] = _UNK_009f41e4;
      init::swizzles[5].m_data[2] = _UNK_009f41e8;
      init::swizzles[5].m_data[3] = _UNK_009f41ec;
      init::swizzles[6].m_data[0] = _DAT_00a06c30;
      init::swizzles[6].m_data[1] = _UNK_00a06c34;
      init::swizzles[6].m_data[2] = _UNK_00a06c38;
      init::swizzles[6].m_data[3] = _UNK_00a06c3c;
      init::swizzles[7].m_data[0] = _DAT_009f41f0;
      init::swizzles[7].m_data[1] = _UNK_009f41f4;
      init::swizzles[7].m_data[2] = _UNK_009f41f8;
      init::swizzles[7].m_data[3] = _UNK_009f41fc;
      __cxa_guard_release(&init()::swizzles);
    }
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D
              (this_00,(this->super_ShaderPerformanceCase).m_renderCtx,this->m_internalFormat,
               local_284,local_288);
    ctx_00 = (EVP_PKEY_CTX *)&texture;
    texture = this_00;
    std::vector<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>::push_back
              (&this->m_textures,(value_type *)ctx_00);
    uVar12 = 1;
    if (uVar6 == 0x2700) {
      uVar12 = (uint)(((long)(texture->m_refTexture).super_TextureLevelPyramid.m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(texture->m_refTexture).super_TextureLevelPyramid.m_access.
                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x28);
    }
    uVar10 = (ulong)((uVar13 & 7) << 4);
    if ((int)uVar12 < 1) {
      uVar12 = 0;
    }
    lVar14 = 0;
    for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      tcu::Texture2D::allocLevel(&texture->m_refTexture,(int)uVar11);
      iVar5 = *(int *)((long)init::swizzles[0].m_data + uVar10);
      iVar4 = *(int *)((long)init::swizzles[0].m_data + uVar10 + 4);
      iVar1 = *(int *)((long)init::swizzles[0].m_data + uVar10 + 8);
      iVar2 = *(int *)((long)init::swizzles[0].m_data + uVar10 + 0xc);
      local_258._4_4_ = fmtInfo.valueMin.m_data[iVar4];
      local_258._0_4_ = fmtInfo.valueMin.m_data[iVar5];
      uStack_250._4_4_ = fmtInfo.valueMin.m_data[iVar2];
      uStack_250._0_4_ = fmtInfo.valueMin.m_data[iVar1];
      local_268._4_4_ = fmtInfo.valueMax.m_data[iVar4];
      local_268._0_4_ = fmtInfo.valueMax.m_data[iVar5];
      uStack_260._4_4_ = fmtInfo.valueMax.m_data[iVar2];
      uStack_260._0_4_ = fmtInfo.valueMax.m_data[iVar1];
      ctx_00 = (EVP_PKEY_CTX *)local_258;
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)
                 ((long)(((texture->m_refTexture).super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                        m_size.m_data + lVar14 + -8),(Vec4 *)local_258,(Vec4 *)local_268);
      lVar14 = lVar14 + 0x28;
    }
    (*texture->_vptr_Texture2D[2])();
  }
  deqp::gls::ShaderPerformanceCase::init(&this->super_ShaderPerformanceCase,ctx_00);
  iVar5 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fragSrc);
  return iVar5;
}

Assistant:

void Texture2DRenderCase::init (void)
{
	TestLog& log = m_testCtx.getLog();

	const tcu::TextureFormat		texFormat	= glu::mapGLInternalFormat(m_internalFormat);
	const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFormat);
	const glu::Precision			samplerPrec	= (texFormat.type == tcu::TextureFormat::FLOAT			||
												   texFormat.type == tcu::TextureFormat::UNSIGNED_INT32	||
												   texFormat.type == tcu::TextureFormat::SIGNED_INT32)
												? glu::PRECISION_HIGHP : glu::PRECISION_MEDIUMP;
	const glu::DataType				samplerType	= glu::getSampler2DType(texFormat);
	const bool						isIntUint	= samplerType == glu::TYPE_INT_SAMPLER_2D || samplerType == glu::TYPE_UINT_SAMPLER_2D;

	int								width		= m_renderCtx.getRenderTarget().getWidth();
	int								height		= m_renderCtx.getRenderTarget().getHeight();

	if (m_powerOfTwo)
	{
		width	= roundDownToPowerOfTwo(width);
		height	= roundDownToPowerOfTwo(height);
	}

	bool mipmaps = m_minFilter == GL_NEAREST_MIPMAP_NEAREST ||
				   m_minFilter == GL_NEAREST_MIPMAP_LINEAR	||
				   m_minFilter == GL_LINEAR_MIPMAP_NEAREST	||
				   m_minFilter == GL_LINEAR_MIPMAP_LINEAR;

	DE_ASSERT(m_powerOfTwo || (!mipmaps && m_wrapS == GL_CLAMP_TO_EDGE && m_wrapT == GL_CLAMP_TO_EDGE));

	Vec2 p00 = (m_coordTransform * Vec3(0.0f, 0.0f, 1.0f)).swizzle(0,1);
	Vec2 p10 = (m_coordTransform * Vec3(1.0f, 0.0f, 1.0f)).swizzle(0,1);
	Vec2 p01 = (m_coordTransform * Vec3(0.0f, 1.0f, 1.0f)).swizzle(0,1);
	Vec2 p11 = (m_coordTransform * Vec3(1.0f, 1.0f, 1.0f)).swizzle(0,1);

	m_attributes.push_back(AttribSpec("a_coords", Vec4(p00.x(), p00.y(), 0.0f, 0.0f),
												  Vec4(p10.x(), p10.y(), 0.0f, 0.0f),
												  Vec4(p01.x(), p01.y(), 0.0f, 0.0f),
												  Vec4(p11.x(), p11.y(), 0.0f, 0.0f)));

	log << TestLog::Message << "Size: " << width << "x" << height << TestLog::EndMessage;
	log << TestLog::Message << "Format: " <<glu::getTextureFormatName(m_internalFormat) << TestLog::EndMessage;
	log << TestLog::Message << "Coords: " << p00 << ", " << p10 << ", " << p01 << ", " << p11 << TestLog::EndMessage;
	log << TestLog::Message << "Wrap: " << glu::getTextureWrapModeStr(m_wrapS) << " / " << glu::getTextureWrapModeStr(m_wrapT) << TestLog::EndMessage;
	log << TestLog::Message << "Filter: " << glu::getTextureFilterStr(m_minFilter) << " / " << glu::getTextureFilterStr(m_magFilter) << TestLog::EndMessage;
	log << TestLog::Message << "Mipmaps: " << (mipmaps ? "true" : "false") << TestLog::EndMessage;
	log << TestLog::Message << "Using additive blending." << TestLog::EndMessage;

	// Use same viewport size as texture size.
	setViewportSize(width, height);

	m_vertShaderSource =
		"#version 300 es\n"
		"in highp vec4 a_position;\n"
		"in mediump vec2 a_coords;\n"
		"out mediump vec2 v_coords;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_coords = a_coords;\n"
		"}\n";

	std::ostringstream fragSrc;
	fragSrc << "#version 300 es\n";
	fragSrc << "layout(location = 0) out mediump vec4 o_color;\n";
	fragSrc << "in mediump vec2 v_coords;\n";

	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
		fragSrc << "uniform " << glu::getPrecisionName(samplerPrec) << " " << glu::getDataTypeName(samplerType) << " u_sampler" << texNdx << ";\n";

	fragSrc << "void main (void)\n"
			<< "{\n";

	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
	{
		if (texNdx == 0)
			fragSrc << "\t" << glu::getPrecisionName(samplerPrec) << " vec4 r = ";
		else
			fragSrc << "\tr += ";

		if (isIntUint)
			fragSrc << "vec4(";

		fragSrc << "texture(u_sampler" << texNdx << ", v_coords)";

		if (isIntUint)
			fragSrc << ")";

		fragSrc << ";\n";
	}

	fragSrc << "	o_color = r;\n"
			<< "}\n";

	m_fragShaderSource = fragSrc.str();

	m_textures.reserve(m_numTextures);
	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
	{
		static const IVec4 swizzles[] = { IVec4(0,1,2,3), IVec4(1,2,3,0), IVec4(2,3,0,1), IVec4(3,0,1,2),
										  IVec4(3,2,1,0), IVec4(2,1,0,3), IVec4(1,0,3,2), IVec4(0,3,2,1) };
		const IVec4& sw = swizzles[texNdx % DE_LENGTH_OF_ARRAY(swizzles)];

		glu::Texture2D* texture = new glu::Texture2D(m_renderCtx, m_internalFormat, width, height);
		m_textures.push_back(texture);

		// Fill levels.
		int numLevels = mipmaps ? texture->getRefTexture().getNumLevels() : 1;
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			// \todo [2013-06-02 pyry] Values are not scaled back to 0..1 range in shaders.
			texture->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(texture->getRefTexture().getLevel(levelNdx),
											fmtInfo.valueMin.swizzle(sw[0], sw[1], sw[2], sw[3]),
											fmtInfo.valueMax.swizzle(sw[0], sw[1], sw[2], sw[3]));
		}

		texture->upload();
	}

	ShaderPerformanceCase::init();
}